

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O2

IVal * __thiscall
deqp::gls::BuiltinPrecisionTests::Constant<float>::doEvaluate
          (IVal *__return_storage_ptr__,Constant<float> *this,EvalContext *param_1)

{
  ScalarTraits<float>::doMakeIVal(&this->m_value);
  return __return_storage_ptr__;
}

Assistant:

IVal	doEvaluate		(const EvalContext&) const	{ return makeIVal(m_value); }